

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infback.c
# Opt level: O3

int inflateBack(z_streamp strm,in_func in,void *in_desc,out_func out,void *out_desc)

{
  byte bVar1;
  byte bVar2;
  internal_state *piVar3;
  void *pvVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  byte *pbVar13;
  Posf *pPVar14;
  ulong uVar15;
  char *pcVar16;
  undefined2 uVar17;
  ushort *puVar18;
  uchar uVar19;
  uint uVar20;
  ulong uVar21;
  ulg uVar22;
  Posf *pPVar23;
  ulong uVar24;
  z_streamp pzVar25;
  ushort uVar26;
  ulong uVar27;
  uchar *__dest;
  uint uVar28;
  internal_state *piVar29;
  bool bVar30;
  uchar *next;
  byte *local_b8;
  z_streamp local_b0;
  uint local_a4;
  void *local_a0;
  internal_state *local_98;
  in_func local_90;
  ulong local_88;
  long *local_80;
  void *local_78;
  out_func local_70;
  ct_data_s *local_68;
  uInt *local_60;
  uint local_54;
  Posf **local_50;
  ct_data_s *local_48;
  uint *local_40;
  uchar *local_38;
  
  if ((strm == (z_streamp)0x0) || (piVar29 = strm->state, piVar29 == (internal_state *)0x0)) {
    return -2;
  }
  strm->msg = (char *)0x0;
  *(undefined8 *)&piVar29->status = 0x3f3f;
  *(undefined4 *)&piVar29->gzindex = 0;
  local_b8 = strm->next_in;
  uVar6 = 0;
  if (local_b8 != (byte *)0x0) {
    uVar6 = strm->avail_in;
  }
  __dest = *(uchar **)&piVar29->method;
  local_a4 = *(uint *)((long)&piVar29->gzhead + 4);
  local_80 = &piVar29->block_start;
  local_48 = piVar29->dyn_ltree + 0x121;
  local_60 = &piVar29->hash_shift;
  local_50 = &piVar29->head;
  local_68 = piVar29->dyn_ltree + 0x91;
  local_40 = (uint *)((long)&piVar29->head + 4);
  iVar11 = 0x3f3f;
  uVar24 = 0;
  uVar27 = 0;
  local_b0 = strm;
  local_98 = piVar29;
  local_90 = in;
  local_78 = out_desc;
  local_70 = out;
  do {
    pzVar25 = local_b0;
    uVar7 = (uint)uVar27;
    iVar10 = -2;
    bVar5 = (byte)uVar27;
    switch(iVar11) {
    case 0x3f3f:
      if (*(int *)&piVar29->field_0xc == 0) {
        if (uVar7 < 3) {
          if ((uVar6 == 0) && (uVar6 = (*local_90)(in_desc,&local_b8), uVar6 == 0)) {
LAB_0010abf3:
            local_b8 = (byte *)0x0;
            iVar10 = -5;
            uVar6 = 0;
            goto switchD_00109e9e_caseD_3f40;
          }
          uVar7 = uVar7 | 8;
          uVar6 = uVar6 - 1;
          uVar24 = uVar24 + ((ulong)*local_b8 << (bVar5 & 0x3f));
          local_b8 = local_b8 + 1;
        }
        *(uint *)&piVar29->field_0xc = (uint)uVar24 & 1;
        switch((uint)(uVar24 >> 1) & 3) {
        case 0:
          iVar11 = 0x3f41;
          break;
        case 1:
          piVar29->window_size = (ulg)fixedtables_lenfix;
          piVar29->head = (Posf *)0x500000009;
          piVar29->prev = (Posf *)fixedtables_distfix;
          iVar11 = 0x3f48;
          break;
        case 2:
          iVar11 = 0x3f44;
          break;
        case 3:
          local_b0->msg = "invalid block type";
          iVar11 = 0x3f51;
        }
        piVar29->status = iVar11;
        uVar24 = uVar24 >> 3;
        uVar27 = (ulong)(uVar7 - 3);
        uVar20 = local_a4;
      }
      else {
        uVar24 = uVar24 >> (bVar5 & 7);
        uVar27 = (ulong)(uVar7 & 0xfffffff8);
        piVar29->status = 0x3f50;
        uVar20 = local_a4;
      }
      break;
    case 0x3f40:
    case 0x3f42:
    case 0x3f43:
    case 0x3f45:
    case 0x3f46:
    case 0x3f47:
switchD_00109e9e_caseD_3f40:
      pzVar25 = local_b0;
LAB_0010ac07:
      pzVar25->next_in = local_b8;
      pzVar25->avail_in = uVar6;
      return iVar10;
    case 0x3f41:
      uVar24 = uVar24 >> (bVar5 & 7);
      if (uVar7 < 0x20) {
        uVar21 = (ulong)(uVar7 & 0x18);
        do {
          if ((uVar6 == 0) && (uVar6 = (*local_90)(in_desc,&local_b8), uVar6 == 0))
          goto LAB_0010abf3;
          uVar6 = uVar6 - 1;
          pbVar13 = local_b8 + 1;
          uVar24 = uVar24 + ((ulong)*local_b8 << ((byte)uVar21 & 0x3f));
          uVar27 = uVar21 + 8;
          bVar30 = uVar21 < 0x18;
          uVar21 = uVar27;
          local_b8 = pbVar13;
        } while (bVar30);
        uVar27 = uVar27 & 0xffffffff;
      }
      else {
        uVar27 = (ulong)(uVar7 & 0xfffffff8);
      }
      pvVar4 = local_78;
      if ((uVar24 >> 0x10 ^ uVar24 & 0xffff) != 0xffff) {
        pcVar16 = "invalid stored block lengths";
        goto LAB_0010a9a8;
      }
      uVar7 = (uint)uVar24 & 0xffff;
      *(uint *)&piVar29->field_0x5c = uVar7;
      if ((uVar24 & 0xffff) != 0) {
        do {
          if ((uVar6 == 0) && (uVar6 = (*local_90)(in_desc,&local_b8), uVar6 == 0))
          goto LAB_0010abf3;
          uVar20 = local_a4;
          if (local_a4 == 0) {
            __dest = *(uchar **)&local_98->method;
            uVar20 = *(uint *)((long)&local_98->gzhead + 4);
            *(uint *)&local_98->gzindex = uVar20;
            iVar11 = (*local_70)(pvVar4,__dest,uVar20);
            if (iVar11 != 0) goto LAB_0010ac3f;
          }
          if (uVar6 <= uVar7) {
            uVar7 = uVar6;
          }
          if (uVar20 <= uVar7) {
            uVar7 = uVar20;
          }
          uVar27 = (ulong)uVar7;
          memcpy(__dest,local_b8,uVar27);
          local_b8 = local_b8 + uVar27;
          uVar6 = uVar6 - uVar7;
          local_a4 = uVar20 - uVar7;
          __dest = __dest + uVar27;
          uVar7 = *(int *)&local_98->field_0x5c - uVar7;
          *(uint *)&local_98->field_0x5c = uVar7;
        } while (uVar7 != 0);
      }
      local_98->status = 0x3f3f;
      uVar24 = 0;
      uVar27 = 0;
      piVar29 = local_98;
      uVar20 = local_a4;
      break;
    case 0x3f44:
      uVar21 = uVar27;
      if (uVar7 < 0xe) {
        do {
          if ((uVar6 == 0) && (uVar6 = (*local_90)(in_desc,&local_b8), uVar6 == 0))
          goto LAB_0010abf3;
          uVar6 = uVar6 - 1;
          pbVar13 = local_b8 + 1;
          uVar24 = uVar24 + ((ulong)*local_b8 << ((byte)uVar21 & 0x3f));
          uVar27 = uVar21 + 8;
          bVar30 = uVar21 < 6;
          piVar29 = local_98;
          uVar21 = uVar27;
          local_b8 = pbVar13;
        } while (bVar30);
      }
      uVar20 = (uint)uVar24 & 0x1f;
      piVar29->hash_size = uVar20 + 0x101;
      uVar9 = (uint)(uVar24 >> 5) & 0x1f;
      piVar29->hash_bits = uVar9 + 1;
      uVar7 = ((uint)(uVar24 >> 10) & 0xf) + 4;
      piVar29->ins_h = uVar7;
      uVar24 = uVar24 >> 0xe;
      uVar27 = (ulong)((int)uVar27 - 0xe);
      if (uVar20 < 0x1e && uVar9 < 0x1e) {
        piVar29->hash_mask = 0;
        uVar21 = 0;
        do {
          uVar20 = (uint)uVar27;
          if (uVar20 < 3) {
            if (uVar6 == 0) {
              uVar6 = (*local_90)(in_desc,&local_b8);
              if (uVar6 == 0) goto LAB_0010abf3;
              uVar7 = piVar29->ins_h;
              uVar21 = (ulong)piVar29->hash_mask;
            }
            uVar20 = uVar20 | 8;
            uVar6 = uVar6 - 1;
            uVar24 = uVar24 + ((ulong)*local_b8 << ((byte)uVar27 & 0x3f));
            local_b8 = local_b8 + 1;
          }
          uVar9 = (int)uVar21 + 1;
          piVar29->hash_mask = uVar9;
          *(ushort *)((long)(piVar29->dyn_ltree + -0xf) + (ulong)inflateBack::order[uVar21] * 2) =
               (ushort)uVar24 & 7;
          uVar24 = uVar24 >> 3;
          uVar27 = (ulong)(uVar20 - 3);
          uVar21 = (ulong)uVar9;
        } while (uVar9 < uVar7);
        if (uVar9 < 0x13) {
          uVar21 = (ulong)uVar9;
          puVar18 = inflateBack::order + uVar21;
          do {
            uVar21 = uVar21 + 1;
            *(undefined2 *)((long)local_80 + (ulong)*puVar18 * 2) = 0;
            puVar18 = puVar18 + 1;
          } while ((int)uVar21 != 0x13);
          piVar29->hash_mask = 0x13;
        }
        *(ct_data_s **)&piVar29->hash_shift = local_48;
        piVar29->window_size = (ulg)local_48;
        *(undefined4 *)&piVar29->head = 7;
        iVar11 = inflate_table(CODES,(unsigned_short *)local_80,0x13,(code **)local_60,
                               (uint *)local_50,(unsigned_short *)local_68);
        if (iVar11 == 0) {
          piVar29->hash_mask = 0;
          uVar7 = piVar29->hash_size;
          pvVar4 = in_desc;
          if (piVar29->hash_bits + uVar7 != 0) {
            do {
              local_a0 = pvVar4;
              uVar22 = piVar29->window_size;
              uVar8 = *(undefined4 *)&piVar29->head;
              uVar21 = (ulong)(~(-1 << ((byte)uVar8 & 0x1f)) & (uint)uVar24);
              bVar5 = *(byte *)(uVar22 + 1 + uVar21 * 4);
              if ((uint)uVar27 < (uint)bVar5) {
                do {
                  if (uVar6 == 0) {
                    uVar6 = (*local_90)(in_desc,&local_b8);
                    if (uVar6 == 0) goto LAB_0010abf3;
                    uVar22 = local_98->window_size;
                    uVar8 = *(undefined4 *)&local_98->head;
                  }
                  pbVar13 = local_b8 + 1;
                  uVar6 = uVar6 - 1;
                  uVar24 = uVar24 + ((ulong)*local_b8 << ((byte)uVar27 & 0x3f));
                  uVar27 = uVar27 + 8;
                  uVar21 = (ulong)(~(-1 << ((byte)uVar8 & 0x1f)) & (uint)uVar24);
                  bVar5 = *(byte *)(uVar22 + 1 + uVar21 * 4);
                  local_b8 = pbVar13;
                } while (uVar27 < bVar5);
                lVar12 = uVar22 + uVar21 * 4;
              }
              else {
                lVar12 = uVar22 + uVar21 * 4;
              }
              uVar20 = (uint)bVar5;
              uVar26 = *(ushort *)(lVar12 + 2);
              uVar7 = (uint)uVar27;
              if (0xf < uVar26) {
                if (uVar26 == 0x10) {
                  if (uVar7 < uVar20 + 2) {
                    local_88 = CONCAT71(local_88._1_7_,bVar5);
                    uVar27 = uVar27 & 0xffffffff;
                    do {
                      if ((uVar6 == 0) && (uVar6 = (*local_90)(local_a0,&local_b8), uVar6 == 0))
                      goto LAB_0010abf3;
                      pbVar13 = local_b8 + 1;
                      uVar6 = uVar6 - 1;
                      uVar24 = uVar24 + ((ulong)*local_b8 << ((byte)uVar27 & 0x3f));
                      uVar27 = uVar27 + 8;
                      local_b8 = pbVar13;
                    } while (uVar27 < uVar20 + 2);
                    bVar5 = (byte)local_88;
                    in_desc = local_a0;
                  }
                  uVar24 = uVar24 >> (bVar5 & 0x3f);
                  uVar20 = (int)uVar27 - uVar20;
                  uVar27 = (ulong)uVar20;
                  if (local_98->hash_mask != 0) {
                    uVar17 = *(undefined2 *)((long)local_80 + (ulong)(local_98->hash_mask - 1) * 2);
                    iVar11 = ((uint)uVar24 & 3) + 3;
                    uVar24 = uVar24 >> 2;
                    uVar20 = uVar20 - 2;
                    goto LAB_0010a57a;
                  }
                }
                else {
                  if (uVar26 == 0x11) {
                    if (uVar7 < uVar20 + 3) {
                      local_88 = CONCAT71(local_88._1_7_,bVar5);
                      uVar27 = uVar27 & 0xffffffff;
                      do {
                        if ((uVar6 == 0) && (uVar6 = (*local_90)(local_a0,&local_b8), uVar6 == 0))
                        goto LAB_0010abf3;
                        pbVar13 = local_b8 + 1;
                        uVar6 = uVar6 - 1;
                        uVar24 = uVar24 + ((ulong)*local_b8 << ((byte)uVar27 & 0x3f));
                        uVar27 = uVar27 + 8;
                        local_b8 = pbVar13;
                      } while (uVar27 < uVar20 + 3);
                      bVar5 = (byte)local_88;
                      in_desc = local_a0;
                    }
                    uVar24 = uVar24 >> (bVar5 & 0x3f);
                    iVar11 = ((uint)uVar24 & 7) + 3;
                    uVar24 = uVar24 >> 3;
                    uVar20 = ((int)uVar27 - uVar20) - 3;
                  }
                  else {
                    if (uVar7 < uVar20 + 7) {
                      local_88 = CONCAT71(local_88._1_7_,bVar5);
                      uVar27 = uVar27 & 0xffffffff;
                      do {
                        if ((uVar6 == 0) && (uVar6 = (*local_90)(local_a0,&local_b8), uVar6 == 0))
                        goto LAB_0010abf3;
                        pbVar13 = local_b8 + 1;
                        uVar6 = uVar6 - 1;
                        uVar24 = uVar24 + ((ulong)*local_b8 << ((byte)uVar27 & 0x3f));
                        uVar27 = uVar27 + 8;
                        local_b8 = pbVar13;
                      } while (uVar27 < uVar20 + 7);
                      bVar5 = (byte)local_88;
                      in_desc = local_a0;
                    }
                    uVar24 = uVar24 >> (bVar5 & 0x3f);
                    iVar11 = ((uint)uVar24 & 0x7f) + 0xb;
                    uVar24 = uVar24 >> 7;
                    uVar20 = ((int)uVar27 - uVar20) - 7;
                  }
                  uVar17 = 0;
LAB_0010a57a:
                  uVar27 = (ulong)uVar20;
                  uVar7 = local_98->hash_size;
                  uVar20 = local_98->hash_mask;
                  uVar9 = local_98->hash_bits + uVar7;
                  if (uVar20 + iVar11 <= uVar9) {
                    do {
                      uVar21 = (ulong)uVar20;
                      uVar20 = uVar20 + 1;
                      *(undefined2 *)((long)local_80 + uVar21 * 2) = uVar17;
                      iVar11 = iVar11 + -1;
                    } while (iVar11 != 0);
                    local_98->hash_mask = uVar20;
                    goto LAB_0010a5b8;
                  }
                }
                pcVar16 = "invalid bit length repeat";
                piVar29 = local_98;
                goto LAB_0010a9a8;
              }
              uVar24 = uVar24 >> (bVar5 & 0x3f);
              uVar27 = (ulong)(uVar7 - uVar20);
              uVar7 = local_98->hash_mask;
              uVar20 = uVar7 + 1;
              local_98->hash_mask = uVar20;
              *(ushort *)((long)(local_98->dyn_ltree + -0xf) + (ulong)uVar7 * 2) = uVar26;
              uVar7 = local_98->hash_size;
              uVar9 = local_98->hash_bits + uVar7;
LAB_0010a5b8:
              piVar29 = local_98;
              pvVar4 = local_a0;
            } while (uVar20 < uVar9);
          }
          uVar20 = local_a4;
          if (piVar29->status == 0x3f51) break;
          if (piVar29->dyn_ltree[0x71].fc.freq == 0) {
            pcVar16 = "invalid code -- missing end-of-block";
          }
          else {
            *(ct_data_s **)&piVar29->hash_shift = local_48;
            piVar29->window_size = (ulg)local_48;
            *(undefined4 *)&piVar29->head = 9;
            iVar11 = inflate_table(LENS,(unsigned_short *)local_80,uVar7,(code **)local_60,
                                   (uint *)local_50,(unsigned_short *)local_68);
            if (iVar11 == 0) {
              piVar29->prev = *(Posf **)&piVar29->hash_shift;
              *(undefined4 *)((long)&piVar29->head + 4) = 6;
              iVar11 = inflate_table(DISTS,(unsigned_short *)
                                           ((long)local_80 + (ulong)piVar29->hash_size * 2),
                                     piVar29->hash_bits,(code **)local_60,local_40,
                                     (unsigned_short *)local_68);
              if (iVar11 == 0) {
                piVar29->status = 0x3f48;
                goto switchD_00109e9e_caseD_3f48;
              }
              pcVar16 = "invalid distances set";
            }
            else {
              pcVar16 = "invalid literal/lengths set";
            }
          }
        }
        else {
          pcVar16 = "invalid code lengths set";
        }
      }
      else {
        pcVar16 = "too many length or distance symbols";
      }
LAB_0010a9a8:
      local_b0->msg = pcVar16;
      piVar29->status = 0x3f51;
      uVar20 = local_a4;
      break;
    case 0x3f48:
switchD_00109e9e_caseD_3f48:
      piVar3 = local_98;
      pzVar25 = local_b0;
      if ((uVar6 < 6) || (local_a4 < 0x102)) {
        uVar22 = piVar29->window_size;
        uVar8 = *(undefined4 *)&piVar29->head;
        uVar21 = (ulong)(~(-1 << ((byte)uVar8 & 0x1f)) & (uint)uVar24);
        bVar5 = *(byte *)(uVar22 + 1 + uVar21 * 4);
        uVar15 = (ulong)bVar5;
        local_a0 = in_desc;
        if ((uint)uVar27 < (uint)bVar5) {
          do {
            if (uVar6 == 0) {
              uVar6 = (*local_90)(local_a0,&local_b8);
              if (uVar6 == 0) goto LAB_0010abf3;
              uVar22 = piVar3->window_size;
              uVar8 = *(undefined4 *)&piVar3->head;
            }
            pbVar13 = local_b8 + 1;
            uVar6 = uVar6 - 1;
            uVar24 = uVar24 + ((ulong)*local_b8 << ((byte)uVar27 & 0x3f));
            uVar27 = uVar27 + 8;
            uVar21 = (ulong)(~(-1 << ((byte)uVar8 & 0x1f)) & (uint)uVar24);
            uVar15 = (ulong)*(byte *)(uVar22 + 1 + uVar21 * 4);
            local_b8 = pbVar13;
          } while (uVar27 < uVar15);
          pbVar13 = (byte *)(uVar22 + uVar21 * 4);
        }
        else {
          pbVar13 = (byte *)(uVar22 + uVar21 * 4);
        }
        uVar20 = (uint)uVar15;
        uVar7 = (uint)uVar27;
        uVar26 = *(ushort *)(pbVar13 + 2);
        bVar5 = *pbVar13;
        if ((byte)(bVar5 - 1) < 0xf) {
          bVar2 = (byte)uVar15;
          uVar9 = (uint)uVar26;
          uVar28 = ~(-1 << (bVar5 + bVar2 & 0x1f));
          uVar21 = (ulong)((((uint)uVar24 & uVar28) >> (bVar2 & 0x1f)) + (uint)uVar26);
          bVar1 = *(byte *)(uVar22 + 1 + uVar21 * 4);
          if (uVar7 < uVar20 + bVar1) {
            uVar27 = uVar27 & 0xffffffff;
            local_88 = CONCAT44(local_88._4_4_,(uint)uVar26);
            local_38 = __dest;
            do {
              if (uVar6 == 0) {
                uVar6 = (*local_90)(local_a0,&local_b8);
                if (uVar6 == 0) goto LAB_0010abf3;
                uVar22 = local_98->window_size;
                __dest = local_38;
                uVar9 = (uint)local_88;
              }
              uVar6 = uVar6 - 1;
              pbVar13 = local_b8 + 1;
              uVar24 = uVar24 + ((ulong)*local_b8 << ((byte)uVar27 & 0x3f));
              uVar27 = uVar27 + 8;
              uVar21 = (ulong)((((uint)uVar24 & uVar28) >> (bVar2 & 0x1f)) + uVar9);
              bVar1 = *(byte *)(uVar22 + 1 + uVar21 * 4);
              local_b8 = pbVar13;
            } while (uVar27 < uVar20 + bVar1);
          }
          pbVar13 = (byte *)(uVar22 + uVar21 * 4);
          uVar24 = uVar24 >> (bVar2 & 0x3f);
          uVar26 = *(ushort *)(pbVar13 + 2);
          bVar5 = *pbVar13;
          uVar7 = (int)uVar27 - uVar20;
          uVar20 = (uint)bVar1;
        }
        piVar29 = local_98;
        pvVar4 = local_a0;
        uVar24 = uVar24 >> ((byte)uVar20 & 0x3f);
        uVar7 = uVar7 - uVar20;
        uVar27 = (ulong)uVar7;
        uVar19 = (uchar)uVar26;
        uVar20 = (uint)uVar26;
        *(uint *)&local_98->field_0x5c = (uint)uVar26;
        if (bVar5 == 0) {
          uVar7 = local_a4;
          if (local_a4 == 0) {
            __dest = *(uchar **)&local_98->method;
            uVar7 = *(uint *)((long)&local_98->gzhead + 4);
            *(uint *)&local_98->gzindex = uVar7;
            iVar11 = (*local_70)(local_78,__dest);
            if (iVar11 != 0) {
LAB_0010ac3f:
              iVar10 = -5;
              goto switchD_00109e9e_caseD_3f40;
            }
            uVar19 = (uchar)*(undefined4 *)&piVar29->field_0x5c;
          }
          *__dest = uVar19;
          __dest = __dest + 1;
          piVar29->status = 0x3f48;
          in_desc = local_a0;
          uVar20 = uVar7 - 1;
        }
        else {
          in_desc = local_a0;
          if ((bVar5 & 0x20) == 0) {
            if ((bVar5 & 0x40) != 0) {
              pcVar16 = "invalid literal/length code";
              goto LAB_0010a9a8;
            }
            uVar9 = bVar5 & 0xf;
            *(uint *)((long)&local_98->window + 4) = uVar9;
            if ((bVar5 & 0xf) != 0) {
              if (uVar7 < uVar9) {
                do {
                  if (uVar6 == 0) {
                    uVar6 = (*local_90)(pvVar4,&local_b8);
                    if (uVar6 == 0) goto LAB_0010abf3;
                    uVar9 = *(uint *)((long)&piVar29->window + 4);
                  }
                  pbVar13 = local_b8 + 1;
                  uVar6 = uVar6 - 1;
                  uVar24 = uVar24 + ((ulong)*local_b8 << ((byte)uVar27 & 0x3f));
                  uVar7 = (int)uVar27 + 8;
                  uVar27 = (ulong)uVar7;
                  local_b8 = pbVar13;
                } while (uVar7 < uVar9);
                uVar20 = *(uint *)&piVar29->field_0x5c;
              }
              *(uint *)&piVar29->field_0x5c =
                   (~(-1 << ((byte)uVar9 & 0x1f)) & (uint)uVar24) + uVar20;
              uVar24 = uVar24 >> ((byte)uVar9 & 0x3f);
              uVar27 = (ulong)(uVar7 - uVar9);
            }
            piVar3 = local_98;
            pPVar23 = piVar29->prev;
            uVar8 = *(undefined4 *)((long)&piVar29->head + 4);
            uVar15 = (ulong)(~(-1 << ((byte)uVar8 & 0x1f)) & (uint)uVar24);
            bVar5 = *(byte *)((long)pPVar23 + uVar15 * 4 + 1);
            uVar21 = (ulong)bVar5;
            if ((uint)uVar27 < (uint)bVar5) {
              do {
                if (uVar6 == 0) {
                  uVar6 = (*local_90)(local_a0,&local_b8);
                  if (uVar6 == 0) goto LAB_0010abf3;
                  pPVar23 = piVar3->prev;
                  uVar8 = *(undefined4 *)((long)&piVar3->head + 4);
                }
                pbVar13 = local_b8 + 1;
                uVar6 = uVar6 - 1;
                uVar24 = uVar24 + ((ulong)*local_b8 << ((byte)uVar27 & 0x3f));
                uVar27 = uVar27 + 8;
                uVar15 = (ulong)(~(-1 << ((byte)uVar8 & 0x1f)) & (uint)uVar24);
                uVar21 = (ulong)*(byte *)((long)pPVar23 + uVar15 * 4 + 1);
                local_b8 = pbVar13;
              } while (uVar27 < uVar21);
              pPVar14 = pPVar23 + uVar15 * 2;
            }
            else {
              pPVar14 = pPVar23 + uVar15 * 2;
            }
            uVar7 = (uint)uVar27;
            uVar26 = pPVar14[1];
            bVar5 = (byte)*pPVar14;
            if (bVar5 < 0x10) {
              bVar2 = (byte)uVar21;
              uVar20 = (uint)uVar26;
              uVar9 = ~(-1 << (bVar5 + bVar2 & 0x1f));
              uVar15 = (ulong)((((uint)uVar24 & uVar9) >> (bVar2 & 0x1f)) + (uint)uVar26);
              bVar1 = *(byte *)((long)pPVar23 + uVar15 * 4 + 1);
              if (uVar7 < (int)uVar21 + (uint)bVar1) {
                uVar27 = uVar27 & 0xffffffff;
                local_88 = uVar21;
                local_54 = (uint)uVar26;
                do {
                  if (uVar6 == 0) {
                    uVar6 = (*local_90)(local_a0,&local_b8);
                    if (uVar6 == 0) goto LAB_0010abf3;
                    pPVar23 = local_98->prev;
                    uVar21 = local_88;
                    uVar20 = local_54;
                  }
                  uVar6 = uVar6 - 1;
                  pbVar13 = local_b8 + 1;
                  uVar24 = uVar24 + ((ulong)*local_b8 << ((byte)uVar27 & 0x3f));
                  uVar27 = uVar27 + 8;
                  uVar15 = (ulong)((((uint)uVar24 & uVar9) >> ((byte)uVar21 & 0x1f)) + uVar20);
                  bVar1 = *(byte *)((long)pPVar23 + uVar15 * 4 + 1);
                  local_b8 = pbVar13;
                } while (uVar27 < (int)uVar21 + (uint)bVar1);
              }
              uVar24 = uVar24 >> (bVar2 & 0x3f);
              uVar26 = (pPVar23 + uVar15 * 2)[1];
              bVar5 = (byte)pPVar23[uVar15 * 2];
              uVar7 = (int)uVar27 - (int)uVar21;
              uVar21 = (ulong)bVar1;
            }
            piVar29 = local_98;
            in_desc = local_a0;
            uVar24 = uVar24 >> ((byte)uVar21 & 0x3f);
            uVar7 = uVar7 - (int)uVar21;
            uVar27 = (ulong)uVar7;
            if ((bVar5 & 0x40) == 0) {
              uVar9 = (uint)uVar26;
              *(uint *)&local_98->window = (uint)uVar26;
              uVar20 = bVar5 & 0xf;
              *(uint *)((long)&local_98->window + 4) = uVar20;
              if ((bVar5 & 0xf) != 0) {
                if (uVar7 < uVar20) {
                  do {
                    if (uVar6 == 0) {
                      uVar6 = (*local_90)(in_desc,&local_b8);
                      if (uVar6 == 0) goto LAB_0010abf3;
                      uVar20 = *(uint *)((long)&piVar29->window + 4);
                    }
                    pbVar13 = local_b8 + 1;
                    uVar6 = uVar6 - 1;
                    uVar24 = uVar24 + ((ulong)*local_b8 << ((byte)uVar27 & 0x3f));
                    uVar7 = (int)uVar27 + 8;
                    uVar27 = (ulong)uVar7;
                    local_b8 = pbVar13;
                  } while (uVar7 < uVar20);
                  uVar9 = *(uint *)&piVar29->window;
                }
                uVar9 = uVar9 + (~(-1 << ((byte)uVar20 & 0x1f)) & (uint)uVar24);
                *(uint *)&piVar29->window = uVar9;
                uVar24 = uVar24 >> ((byte)uVar20 & 0x3f);
                uVar27 = (ulong)(uVar7 - uVar20);
              }
              uVar7 = *(uint *)((long)&piVar29->gzhead + 4);
              uVar28 = 0;
              if ((uint)piVar29->gzindex < uVar7) {
                uVar28 = local_a4;
              }
              uVar20 = local_a4;
              if (uVar7 - uVar28 < uVar9) {
                pcVar16 = "invalid distance too far back";
                goto LAB_0010a9a8;
              }
              do {
                uVar7 = *(uint *)((long)&piVar29->gzhead + 4);
                if (uVar20 == 0) {
                  __dest = *(uchar **)&piVar29->method;
                  *(uint *)&piVar29->gzindex = uVar7;
                  iVar11 = (*local_70)(local_78,__dest,uVar7);
                  if (iVar11 != 0) goto LAB_0010ac3f;
                  uVar20 = uVar7;
                  uVar7 = *(uint *)((long)&piVar29->gzhead + 4);
                }
                uVar7 = uVar7 - *(uint *)&piVar29->window;
                uVar21 = (ulong)uVar7;
                bVar30 = uVar20 <= uVar7;
                if (bVar30) {
                  uVar7 = 0;
                }
                uVar9 = *(uint *)&piVar29->field_0x5c;
                if (bVar30) {
                  uVar21 = -(ulong)*(uint *)&piVar29->window;
                }
                uVar28 = uVar20 - uVar7;
                if (uVar9 <= uVar20 - uVar7) {
                  uVar28 = uVar9;
                }
                *(uint *)&piVar29->field_0x5c = uVar9 - uVar28;
                uVar7 = uVar28;
                do {
                  *__dest = __dest[uVar21];
                  __dest = __dest + 1;
                  uVar7 = uVar7 - 1;
                } while (uVar7 != 0);
                uVar20 = uVar20 - uVar28;
                in_desc = local_a0;
              } while (*(int *)&piVar29->field_0x5c != 0);
            }
            else {
              local_b0->msg = "invalid distance code";
              local_98->status = 0x3f51;
              uVar20 = local_a4;
            }
          }
          else {
            local_98->status = 0x3f3f;
            uVar20 = local_a4;
          }
        }
      }
      else {
        local_b0->next_out = __dest;
        local_b0->avail_out = local_a4;
        local_b0->next_in = local_b8;
        local_b0->avail_in = uVar6;
        piVar29->w_size = (int)uVar24;
        piVar29->w_bits = (int)(uVar24 >> 0x20);
        piVar29->w_mask = (uint)uVar27;
        uVar6 = *(uint *)((long)&piVar29->gzhead + 4);
        if ((uint)piVar29->gzindex < uVar6) {
          *(uint *)&piVar29->gzindex = uVar6 - local_a4;
        }
        inflate_fast(local_b0,uVar6);
        local_b8 = pzVar25->next_in;
        __dest = pzVar25->next_out;
        uVar6 = pzVar25->avail_in;
        uVar24._0_4_ = piVar29->w_size;
        uVar24._4_4_ = piVar29->w_bits;
        uVar27 = (ulong)piVar29->w_mask;
        uVar20 = pzVar25->avail_out;
      }
      break;
    default:
      if (iVar11 == 0x3f50) {
        uVar7 = *(uint *)((long)&piVar29->gzhead + 4);
        iVar10 = 1;
        uVar20 = uVar7 - local_a4;
        if (local_a4 <= uVar7 && uVar20 != 0) {
          iVar11 = (*local_70)(local_78,*(uchar **)&piVar29->method,uVar20);
          iVar10 = -5;
          if (iVar11 == 0) {
            iVar10 = 1;
          }
        }
      }
      else if (iVar11 == 0x3f51) {
        iVar10 = -3;
      }
      goto LAB_0010ac07;
    }
    local_a4 = uVar20;
    iVar11 = piVar29->status;
  } while( true );
}

Assistant:

int ZEXPORT inflateBack(strm, in, in_desc, out, out_desc)
z_streamp strm;
in_func in;
void FAR *in_desc;
out_func out;
void FAR *out_desc;
{
    struct inflate_state FAR *state;
    z_const unsigned char FAR *next;    /* next input */
    unsigned char FAR *put;     /* next output */
    unsigned have, left;        /* available input and output */
    unsigned long hold;         /* bit buffer */
    unsigned bits;              /* bits in bit buffer */
    unsigned copy;              /* number of stored or match bytes to copy */
    unsigned char FAR *from;    /* where to copy match bytes from */
    code here;                  /* current decoding table entry */
    code last;                  /* parent table entry */
    unsigned len;               /* length to copy for repeats, bits to drop */
    int ret;                    /* return code */
    static const unsigned short order[19] = /* permutation of code lengths */
        {16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15};

    /* Check that the strm exists and that the state was initialized */
    if (strm == Z_NULL || strm->state == Z_NULL)
        return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;

    /* Reset the state */
    strm->msg = Z_NULL;
    state->mode = TYPE;
    state->last = 0;
    state->whave = 0;
    next = strm->next_in;
    have = next != Z_NULL ? strm->avail_in : 0;
    hold = 0;
    bits = 0;
    put = state->window;
    left = state->wsize;

    /* Inflate until end of block marked as last */
    for (;;)
        switch (state->mode) {
        case TYPE:
            /* determine and dispatch block type */
            if (state->last) {
                BYTEBITS();
                state->mode = DONE;
                break;
            }
            NEEDBITS(3);
            state->last = BITS(1);
            DROPBITS(1);
            switch (BITS(2)) {
            case 0:                             /* stored block */
                Tracev((stderr, "inflate:     stored block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = STORED;
                break;
            case 1:                             /* fixed block */
                fixedtables(state);
                Tracev((stderr, "inflate:     fixed codes block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = LEN;              /* decode codes */
                break;
            case 2:                             /* dynamic block */
                Tracev((stderr, "inflate:     dynamic codes block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = TABLE;
                break;
            case 3:
                strm->msg = (char *)"invalid block type";
                state->mode = BAD;
            }
            DROPBITS(2);
            break;

        case STORED:
            /* get and verify stored block length */
            BYTEBITS();                         /* go to byte boundary */
            NEEDBITS(32);
            if ((hold & 0xffff) != ((hold >> 16) ^ 0xffff)) {
                strm->msg = (char *)"invalid stored block lengths";
                state->mode = BAD;
                break;
            }
            state->length = (unsigned)hold & 0xffff;
            Tracev((stderr, "inflate:       stored length %u\n",
                    state->length));
            INITBITS();

            /* copy stored block from input to output */
            while (state->length != 0) {
                copy = state->length;
                PULL();
                ROOM();
                if (copy > have) copy = have;
                if (copy > left) copy = left;
                zmemcpy(put, next, copy);
                have -= copy;
                next += copy;
                left -= copy;
                put += copy;
                state->length -= copy;
            }
            Tracev((stderr, "inflate:       stored end\n"));
            state->mode = TYPE;
            break;

        case TABLE:
            /* get dynamic table entries descriptor */
            NEEDBITS(14);
            state->nlen = BITS(5) + 257;
            DROPBITS(5);
            state->ndist = BITS(5) + 1;
            DROPBITS(5);
            state->ncode = BITS(4) + 4;
            DROPBITS(4);
#ifndef PKZIP_BUG_WORKAROUND
            if (state->nlen > 286 || state->ndist > 30) {
                strm->msg = (char *)"too many length or distance symbols";
                state->mode = BAD;
                break;
            }
#endif
            Tracev((stderr, "inflate:       table sizes ok\n"));

            /* get code length code lengths (not a typo) */
            state->have = 0;
            while (state->have < state->ncode) {
                NEEDBITS(3);
                state->lens[order[state->have++]] = (unsigned short)BITS(3);
                DROPBITS(3);
            }
            while (state->have < 19)
                state->lens[order[state->have++]] = 0;
            state->next = state->codes;
            state->lencode = (code const FAR *)(state->next);
            state->lenbits = 7;
            ret = inflate_table(CODES, state->lens, 19, &(state->next),
                                &(state->lenbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid code lengths set";
                state->mode = BAD;
                break;
            }
            Tracev((stderr, "inflate:       code lengths ok\n"));

            /* get length and distance code code lengths */
            state->have = 0;
            while (state->have < state->nlen + state->ndist) {
                for (;;) {
                    here = state->lencode[BITS(state->lenbits)];
                    if ((unsigned)(here.bits) <= bits) break;
                    PULLBYTE();
                }
                if (here.val < 16) {
                    DROPBITS(here.bits);
                    state->lens[state->have++] = here.val;
                }
                else {
                    if (here.val == 16) {
                        NEEDBITS(here.bits + 2);
                        DROPBITS(here.bits);
                        if (state->have == 0) {
                            strm->msg = (char *)"invalid bit length repeat";
                            state->mode = BAD;
                            break;
                        }
                        len = (unsigned)(state->lens[state->have - 1]);
                        copy = 3 + BITS(2);
                        DROPBITS(2);
                    }
                    else if (here.val == 17) {
                        NEEDBITS(here.bits + 3);
                        DROPBITS(here.bits);
                        len = 0;
                        copy = 3 + BITS(3);
                        DROPBITS(3);
                    }
                    else {
                        NEEDBITS(here.bits + 7);
                        DROPBITS(here.bits);
                        len = 0;
                        copy = 11 + BITS(7);
                        DROPBITS(7);
                    }
                    if (state->have + copy > state->nlen + state->ndist) {
                        strm->msg = (char *)"invalid bit length repeat";
                        state->mode = BAD;
                        break;
                    }
                    while (copy--)
                        state->lens[state->have++] = (unsigned short)len;
                }
            }

            /* handle error breaks in while */
            if (state->mode == BAD) break;

            /* check for end-of-block code (better have one) */
            if (state->lens[256] == 0) {
                strm->msg = (char *)"invalid code -- missing end-of-block";
                state->mode = BAD;
                break;
            }

            /* build code tables -- note: do not change the lenbits or distbits
               values here (9 and 6) without reading the comments in inftrees.h
               concerning the ENOUGH constants, which depend on those values */
            state->next = state->codes;
            state->lencode = (code const FAR *)(state->next);
            state->lenbits = 9;
            ret = inflate_table(LENS, state->lens, state->nlen, &(state->next),
                                &(state->lenbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid literal/lengths set";
                state->mode = BAD;
                break;
            }
            state->distcode = (code const FAR *)(state->next);
            state->distbits = 6;
            ret = inflate_table(DISTS, state->lens + state->nlen, state->ndist,
                            &(state->next), &(state->distbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid distances set";
                state->mode = BAD;
                break;
            }
            Tracev((stderr, "inflate:       codes ok\n"));
            state->mode = LEN;

        case LEN:
            /* use inflate_fast() if we have enough input and output */
            if (have >= 6 && left >= 258) {
                RESTORE();
                if (state->whave < state->wsize)
                    state->whave = state->wsize - left;
                inflate_fast(strm, state->wsize);
                LOAD();
                break;
            }

            /* get a literal, length, or end-of-block code */
            for (;;) {
                here = state->lencode[BITS(state->lenbits)];
                if ((unsigned)(here.bits) <= bits) break;
                PULLBYTE();
            }
            if (here.op && (here.op & 0xf0) == 0) {
                last = here;
                for (;;) {
                    here = state->lencode[last.val +
                            (BITS(last.bits + last.op) >> last.bits)];
                    if ((unsigned)(last.bits + here.bits) <= bits) break;
                    PULLBYTE();
                }
                DROPBITS(last.bits);
            }
            DROPBITS(here.bits);
            state->length = (unsigned)here.val;

            /* process literal */
            if (here.op == 0) {
                Tracevv((stderr, here.val >= 0x20 && here.val < 0x7f ?
                        "inflate:         literal '%c'\n" :
                        "inflate:         literal 0x%02x\n", here.val));
                ROOM();
                *put++ = (unsigned char)(state->length);
                left--;
                state->mode = LEN;
                break;
            }

            /* process end of block */
            if (here.op & 32) {
                Tracevv((stderr, "inflate:         end of block\n"));
                state->mode = TYPE;
                break;
            }

            /* invalid code */
            if (here.op & 64) {
                strm->msg = (char *)"invalid literal/length code";
                state->mode = BAD;
                break;
            }

            /* length code -- get extra bits, if any */
            state->extra = (unsigned)(here.op) & 15;
            if (state->extra != 0) {
                NEEDBITS(state->extra);
                state->length += BITS(state->extra);
                DROPBITS(state->extra);
            }
            Tracevv((stderr, "inflate:         length %u\n", state->length));

            /* get distance code */
            for (;;) {
                here = state->distcode[BITS(state->distbits)];
                if ((unsigned)(here.bits) <= bits) break;
                PULLBYTE();
            }
            if ((here.op & 0xf0) == 0) {
                last = here;
                for (;;) {
                    here = state->distcode[last.val +
                            (BITS(last.bits + last.op) >> last.bits)];
                    if ((unsigned)(last.bits + here.bits) <= bits) break;
                    PULLBYTE();
                }
                DROPBITS(last.bits);
            }
            DROPBITS(here.bits);
            if (here.op & 64) {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
            state->offset = (unsigned)here.val;

            /* get distance extra bits, if any */
            state->extra = (unsigned)(here.op) & 15;
            if (state->extra != 0) {
                NEEDBITS(state->extra);
                state->offset += BITS(state->extra);
                DROPBITS(state->extra);
            }
            if (state->offset > state->wsize - (state->whave < state->wsize ?
                                                left : 0)) {
                strm->msg = (char *)"invalid distance too far back";
                state->mode = BAD;
                break;
            }
            Tracevv((stderr, "inflate:         distance %u\n", state->offset));

            /* copy match from window to output */
            do {
                ROOM();
                copy = state->wsize - state->offset;
                if (copy < left) {
                    from = put + copy;
                    copy = left - copy;
                }
                else {
                    from = put - state->offset;
                    copy = left;
                }
                if (copy > state->length) copy = state->length;
                state->length -= copy;
                left -= copy;
                do {
                    *put++ = *from++;
                } while (--copy);
            } while (state->length != 0);
            break;

        case DONE:
            /* inflate stream terminated properly -- write leftover output */
            ret = Z_STREAM_END;
            if (left < state->wsize) {
                if (out(out_desc, state->window, state->wsize - left))
                    ret = Z_BUF_ERROR;
            }
            goto inf_leave;

        case BAD:
            ret = Z_DATA_ERROR;
            goto inf_leave;

        default:                /* can't happen, but makes compilers happy */
            ret = Z_STREAM_ERROR;
            goto inf_leave;
        }

    /* Return unused input */
  inf_leave:
    strm->next_in = next;
    strm->avail_in = have;
    return ret;
}